

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall
asmjit::_abi_1_10::ZoneAllocator::_releaseDynamic(ZoneAllocator *this,void *p,size_t size)

{
  DynamicBlock *block_00;
  DynamicBlock *pDVar1;
  DynamicBlock *pDVar2;
  bool bVar3;
  long in_RSI;
  ZoneAllocator *in_RDI;
  DynamicBlock *next;
  DynamicBlock *prev;
  DynamicBlock *block;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  unsigned_long local_18;
  long local_10;
  
  local_10 = in_RSI;
  DebugUtils::unused<unsigned_long&>(&local_18);
  bVar3 = isInitialized(in_RDI);
  if (!bVar3) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  block_00 = *(DynamicBlock **)(local_10 + -8);
  bVar3 = ZoneAllocator_hasDynamicBlock(in_RDI,block_00);
  if (!bVar3) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  pDVar1 = block_00->prev;
  pDVar2 = block_00->next;
  if (pDVar1 == (DynamicBlock *)0x0) {
    in_RDI->_dynamicBlocks = pDVar2;
  }
  else {
    pDVar1->next = pDVar2;
  }
  if (pDVar2 != (DynamicBlock *)0x0) {
    pDVar2->prev = pDVar1;
  }
  free(block_00);
  return;
}

Assistant:

void ZoneAllocator::_releaseDynamic(void* p, size_t size) noexcept {
  DebugUtils::unused(size);
  ASMJIT_ASSERT(isInitialized());

  // Pointer to `DynamicBlock` is stored at [-1].
  DynamicBlock* block = reinterpret_cast<DynamicBlock**>(p)[-1];
  ASMJIT_ASSERT(ZoneAllocator_hasDynamicBlock(this, block));

  // Unlink and free.
  DynamicBlock* prev = block->prev;
  DynamicBlock* next = block->next;

  if (prev)
    prev->next = next;
  else
    _dynamicBlocks = next;

  if (next)
    next->prev = prev;

  ::free(block);
}